

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::FunctionObject::
binary<tcu::Matrix<double,_2,_3>,_tcu::Vector<double,_2>,_tcu::Vector<double,_3>_>::call
          (binary<tcu::Matrix<double,_2,_3>,_tcu::Vector<double,_2>,_tcu::Vector<double,_3>_> *this,
          GLvoid *result_dst,GLvoid *argument_src)

{
  code *pcVar1;
  GLuint GVar2;
  undefined8 *puVar3;
  bool bVar4;
  GLdouble *data;
  long lVar5;
  long lVar6;
  undefined8 *puVar7;
  undefined1 auVar8 [16];
  bool bVar10;
  undefined8 uVar11;
  Matrix<double,_2,_3> result;
  undefined8 local_a8 [8];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 local_50 [6];
  long lVar9;
  
  lVar6 = 0;
  GVar2 = GPUShaderFP64Test10::functionObject::getArgumentStride((functionObject *)this,0);
  pcVar1 = (code *)(this->super_binaryBase).super_functionObject.m_p_function;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  puVar3 = local_a8;
  bVar10 = true;
  do {
    bVar4 = bVar10;
    lVar5 = 0;
    auVar8 = _DAT_019fcc00;
    do {
      bVar10 = SUB164(auVar8 ^ _DAT_019f5ce0,4) == DAT_01a45900._4_4_ &&
               SUB164(auVar8 ^ _DAT_019f5ce0,0) < DAT_01a45900;
      if (bVar10) {
        uVar11 = 0x3ff0000000000000;
        if (lVar6 * 0x10 != lVar5) {
          uVar11 = 0;
        }
        *(undefined8 *)((long)puVar3 + lVar5) = uVar11;
      }
      if (bVar10) {
        uVar11 = 0x3ff0000000000000;
        if (lVar6 * 0x10 + -0x10 != lVar5) {
          uVar11 = 0;
        }
        *(undefined8 *)((long)puVar3 + lVar5 + 0x10) = uVar11;
      }
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar9 + 2;
      lVar5 = lVar5 + 0x20;
    } while (lVar5 != 0x40);
    lVar6 = 1;
    puVar3 = local_a8 + 1;
    bVar10 = false;
  } while (bVar4);
  local_a8[6] = *argument_src;
  local_a8[7] = *(undefined8 *)((long)argument_src + 8);
  puVar3 = (undefined8 *)((long)argument_src + (ulong)GVar2);
  local_68 = *puVar3;
  uStack_60 = puVar3[1];
  local_58 = *(undefined8 *)((long)argument_src + (ulong)GVar2 + 0x10);
  (*pcVar1)(local_50);
  puVar3 = local_a8;
  puVar7 = local_50;
  bVar10 = true;
  do {
    bVar4 = bVar10;
    lVar6 = 0;
    do {
      *(undefined8 *)((long)puVar3 + lVar6) = *(undefined8 *)((long)puVar7 + lVar6);
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x30);
    puVar3 = local_a8 + 1;
    puVar7 = local_50 + 1;
    bVar10 = false;
  } while (bVar4);
  lVar6 = 0;
  do {
    uVar11 = *(undefined8 *)((long)local_a8 + lVar6 + 8U);
    *(undefined8 *)((long)result_dst + lVar6) = *(undefined8 *)((long)local_a8 + lVar6);
    ((undefined8 *)((long)result_dst + lVar6))[1] = uVar11;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x30);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		const glw::GLuint argument_1_stride = getArgumentStride(0);

		functionPointer p_function = (functionPointer)m_p_function;

		Arg1T arg_1;
		Arg2T arg_2;
		ResT  result;

		unpack<Arg1T>::get(argument_src, arg_1);
		unpack<Arg2T>::get((glw::GLubyte*)argument_src + argument_1_stride, arg_2);

		result = p_function(arg_1, arg_2);

		pack<ResT>::set(result_dst, result);
	}